

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test
::ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test
          (ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test *this)

{
  ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseErrorTest);
  (this->super_ParseErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test_02a0da58;
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedPositiveNumberOutOfRange) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "FOO = 1;\n"
      "  reserved 2147483648;\n"
      "}\n",
      "2:11: Integer out of range.\n");
}